

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O1

void Abc_SclWriteScl(char *pFileName,SC_Lib *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  Vec_Str_t *vOut;
  char *pcVar8;
  FILE *__s;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  vOut = (Vec_Str_t *)malloc(0x10);
  vOut->nCap = 10000;
  vOut->nSize = 0;
  pcVar8 = (char *)malloc(10000);
  vOut->pArray = pcVar8;
  vOut->nSize = 1;
  *pcVar8 = '\b';
  Vec_StrPutS(vOut,p->pName);
  Vec_StrPutS(vOut,p->default_wire_load);
  Vec_StrPutS(vOut,p->default_wire_load_sel);
  Vec_StrPutF(vOut,p->default_max_out_slew);
  if (p->unit_time < 0) {
    __assert_fail("p->unit_time >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                  ,0x167,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  if (p->unit_cap_snd < 0) {
    __assert_fail("p->unit_cap_snd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                  ,0x168,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
  }
  Vec_StrPutI(vOut,p->unit_time);
  Vec_StrPutF(vOut,p->unit_cap_fst);
  Vec_StrPutI(vOut,p->unit_cap_snd);
  Vec_StrPutI(vOut,(p->vWireLoads).nSize);
  if (0 < (p->vWireLoads).nSize) {
    lVar14 = 0;
    do {
      puVar1 = (undefined8 *)(p->vWireLoads).pArray[lVar14];
      Vec_StrPutS(vOut,(char *)*puVar1);
      Vec_StrPutF(vOut,*(float *)(puVar1 + 1));
      Vec_StrPutF(vOut,*(float *)((long)puVar1 + 0xc));
      Vec_StrPutI(vOut,*(int *)((long)puVar1 + 0x14));
      if (0 < *(int *)((long)puVar1 + 0x14)) {
        lVar12 = 0;
        do {
          Vec_StrPutI(vOut,*(int *)(puVar1[3] + lVar12 * 4));
          if (*(int *)((long)puVar1 + 0x24) <= lVar12) goto LAB_003d75fe;
          Vec_StrPutF(vOut,*(float *)(puVar1[5] + lVar12 * 4));
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)puVar1 + 0x14));
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vWireLoads).nSize);
  }
  Vec_StrPutI(vOut,(p->vWireLoadSels).nSize);
  if (0 < (p->vWireLoadSels).nSize) {
    lVar14 = 0;
    do {
      puVar1 = (undefined8 *)(p->vWireLoadSels).pArray[lVar14];
      Vec_StrPutS(vOut,(char *)*puVar1);
      Vec_StrPutI(vOut,*(int *)((long)puVar1 + 0xc));
      if (0 < *(int *)((long)puVar1 + 0xc)) {
        lVar12 = 0;
        do {
          Vec_StrPutF(vOut,*(float *)(puVar1[2] + lVar12 * 4));
          if (*(int *)((long)puVar1 + 0x1c) <= lVar12) {
LAB_003d75fe:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          Vec_StrPutF(vOut,*(float *)(puVar1[4] + lVar12 * 4));
          if (*(int *)((long)puVar1 + 0x2c) <= lVar12) goto LAB_003d761d;
          Vec_StrPutS(vOut,*(char **)(puVar1[6] + lVar12 * 8));
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)puVar1 + 0xc));
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vWireLoadSels).nSize);
  }
  lVar14 = (long)(p->vCells).nSize;
  if (lVar14 < 1) {
    iVar11 = 0;
  }
  else {
    lVar12 = 0;
    iVar11 = 0;
    do {
      pvVar2 = (p->vCells).pArray[lVar12];
      if (*(int *)((long)pvVar2 + 0x10) == 0) {
        iVar11 = iVar11 + (uint)(*(int *)((long)pvVar2 + 0x14) == 0);
      }
      lVar12 = lVar12 + 1;
    } while (lVar14 != lVar12);
  }
  Vec_StrPutI(vOut,iVar11);
  if (0 < (p->vCells).nSize) {
    lVar14 = 0;
    do {
      puVar1 = (undefined8 *)(p->vCells).pArray[lVar14];
      if ((*(int *)(puVar1 + 2) == 0) && (*(int *)((long)puVar1 + 0x14) == 0)) {
        Vec_StrPutS(vOut,(char *)*puVar1);
        Vec_StrPutF(vOut,*(float *)(puVar1 + 3));
        Vec_StrPutF(vOut,*(float *)((long)puVar1 + 0x1c));
        Vec_StrPutI(vOut,*(int *)(puVar1 + 5));
        Vec_StrPutI(vOut,*(int *)(puVar1 + 8));
        Vec_StrPutI(vOut,*(int *)((long)puVar1 + 0x44));
        uVar7 = *(uint *)(puVar1 + 8);
        if (0 < (int)uVar7) {
          lVar12 = 0;
          do {
            if (*(int *)((long)puVar1 + 0x34) <= lVar12) goto LAB_003d761d;
            puVar3 = *(undefined8 **)(puVar1[7] + lVar12 * 8);
            if (*(int *)(puVar3 + 1) != 1) {
              __assert_fail("pPin->dir == sc_dir_Input",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                            ,0x1a2,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            Vec_StrPutS(vOut,(char *)*puVar3);
            Vec_StrPutF(vOut,*(float *)(puVar3 + 2));
            Vec_StrPutF(vOut,*(float *)((long)puVar3 + 0x14));
            lVar12 = lVar12 + 1;
            uVar7 = *(uint *)(puVar1 + 8);
          } while (lVar12 < (int)uVar7);
        }
        if ((int)uVar7 < *(int *)((long)puVar1 + 0x34)) {
          if ((int)uVar7 < 0) {
LAB_003d761d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar9 = (ulong)uVar7;
          do {
            puVar3 = *(undefined8 **)(puVar1[7] + uVar9 * 8);
            if (*(int *)(puVar3 + 1) != 2) {
              __assert_fail("pPin->dir == sc_dir_Output",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                            ,0x1ad,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            Vec_StrPutS(vOut,(char *)*puVar3);
            Vec_StrPutF(vOut,*(float *)(puVar3 + 4));
            Vec_StrPutF(vOut,*(float *)((long)puVar3 + 0x24));
            Vec_StrPutI(vOut,*(int *)(puVar1 + 8));
            pcVar8 = (char *)puVar3[5];
            if (pcVar8 == (char *)0x0) {
              pcVar8 = "";
            }
            Vec_StrPutS(vOut,pcVar8);
            iVar11 = 1 << ((char)*(int *)(puVar1 + 8) - 6U & 0x1f);
            if (*(int *)(puVar1 + 8) < 7) {
              iVar11 = 1;
            }
            if (*(int *)((long)puVar3 + 0x34) != iVar11) {
              __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                            ,0x1b7,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            if (0 < *(int *)((long)puVar3 + 0x34)) {
              lVar12 = 0;
              do {
                uVar4 = *(ulong *)(puVar3[7] + lVar12 * 8);
                lVar10 = (long)vOut->nSize;
                uVar7 = vOut->nCap;
                pcVar8 = vOut->pArray;
                lVar13 = 0;
                do {
                  if ((uint)lVar10 == uVar7) {
                    if ((int)uVar7 < 0x10) {
                      if (pcVar8 == (char *)0x0) {
                        pcVar8 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar8 = (char *)realloc(pcVar8,0x10);
                      }
                      uVar7 = 0x10;
                    }
                    else {
                      uVar6 = uVar7 * 2;
                      if (SBORROW4(uVar7,uVar6) != 0 < (int)uVar7) {
                        uVar7 = uVar6;
                        if (pcVar8 == (char *)0x0) {
                          pcVar8 = (char *)malloc((ulong)uVar6);
                        }
                        else {
                          pcVar8 = (char *)realloc(pcVar8,(ulong)uVar6);
                        }
                      }
                    }
                  }
                  pcVar8[lVar10] = (char)(uVar4 >> ((byte)lVar13 & 0x3f));
                  lVar10 = lVar10 + 1;
                  lVar13 = lVar13 + 8;
                } while (lVar13 != 0x40);
                vOut->nSize = (int)lVar10;
                vOut->nCap = uVar7;
                vOut->pArray = pcVar8;
                lVar12 = lVar12 + 1;
              } while (lVar12 < *(int *)((long)puVar3 + 0x34));
            }
            if (*(int *)((long)puVar3 + 0x44) != *(int *)(puVar1 + 8)) {
              __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                            ,0x1bc,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
            }
            if (0 < *(int *)((long)puVar3 + 0x44)) {
              lVar12 = 0;
              do {
                puVar5 = *(undefined8 **)(puVar3[9] + lVar12 * 8);
                Vec_StrPutS(vOut,(char *)*puVar5);
                Vec_StrPutI(vOut,*(int *)((long)puVar5 + 0xc));
                if (*(int *)((long)puVar5 + 0xc) != 0) {
                  if (*(int *)((long)puVar5 + 0xc) != 1) {
                    __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibScl.c"
                                  ,0x1d0,"void Abc_SclWriteLibrary(Vec_Str_t *, SC_Lib *)");
                  }
                  lVar10 = *(long *)puVar5[2];
                  Vec_StrPutI(vOut,*(int *)(lVar10 + 8));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar10 + 0x18));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar10 + 200));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar10 + 0x178));
                  Abc_SclWriteSurface(vOut,(SC_Surface *)(lVar10 + 0x228));
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < *(int *)((long)puVar3 + 0x44));
            }
            uVar9 = uVar9 + 1;
          } while ((int)uVar9 < *(int *)((long)puVar1 + 0x34));
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vCells).nSize);
  }
  iVar11 = vOut->nSize;
  if (0 < (long)iVar11) {
    __s = fopen(pFileName,"wb");
    if (__s == (FILE *)0x0) {
      printf("Cannot open file \"%s\" for writing.\n",pFileName);
    }
    else {
      fwrite(vOut->pArray,1,(long)iVar11,__s);
      fclose(__s);
    }
  }
  if (vOut->pArray != (char *)0x0) {
    free(vOut->pArray);
    vOut->pArray = (char *)0x0;
  }
  if (vOut == (Vec_Str_t *)0x0) {
    return;
  }
  free(vOut);
  return;
}

Assistant:

void Abc_SclWriteScl( char * pFileName, SC_Lib * p )
{
    Vec_Str_t * vOut;
    vOut = Vec_StrAlloc( 10000 );
    Abc_SclWriteLibrary( vOut, p );
    if ( Vec_StrSize(vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFree( vOut );    
}